

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_range_join.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalRangeJoin::ProjectResult(PhysicalRangeJoin *this,DataChunk *chunk,DataChunk *result)

{
  pointer pLVar1;
  pointer pLVar2;
  reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  size_type sVar7;
  idx_t i_1;
  ulong __n;
  idx_t i;
  size_type __n_00;
  
  sVar7 = (long)(this->left_projection_map).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->left_projection_map).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  for (__n_00 = 0; sVar7 != __n_00; __n_00 = __n_00 + 1) {
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&result->data,__n_00);
    pvVar4 = vector<unsigned_long,_true>::get<true>(&this->left_projection_map,__n_00);
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,*pvVar4);
    Vector::Reference(pvVar3,pvVar5);
  }
  pvVar6 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                     (&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.children,0);
  pLVar1 = (pvVar6->_M_data->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar2 = (pvVar6->_M_data->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (__n = 0; __n < (ulong)((long)(this->right_projection_map).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->right_projection_map).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&result->data,sVar7 + __n);
    pvVar4 = vector<unsigned_long,_true>::get<true>(&this->right_projection_map,__n);
    pvVar5 = vector<duckdb::Vector,_true>::get<true>
                       (&chunk->data,*pvVar4 + ((long)pLVar1 - (long)pLVar2) / 0x18);
    Vector::Reference(pvVar3,pvVar5);
  }
  result->count = chunk->count;
  return;
}

Assistant:

void PhysicalRangeJoin::ProjectResult(DataChunk &chunk, DataChunk &result) const {
	const auto left_projected = left_projection_map.size();
	for (idx_t i = 0; i < left_projected; ++i) {
		result.data[i].Reference(chunk.data[left_projection_map[i]]);
	}
	const auto left_width = children[0].get().GetTypes().size();
	for (idx_t i = 0; i < right_projection_map.size(); ++i) {
		result.data[left_projected + i].Reference(chunk.data[left_width + right_projection_map[i]]);
	}
	result.SetCardinality(chunk);
}